

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O0

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff10;
  Mat *in_stack_ffffffffffffff18;
  Mat *this_00;
  int local_cc;
  Mat local_c8;
  float *local_90;
  int local_84;
  int local_80;
  Mat local_70;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = *(int *)(in_RSI + 0x28);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = local_1c * local_20;
  if ((*(float *)(in_RDI + 0x80) != 0.0) || (NAN(*(float *)(in_RDI + 0x80)))) {
    for (local_84 = 0; local_84 < local_24; local_84 = local_84 + 1) {
      Mat::channel(in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      in_stack_ffffffffffffff10 = Mat::operator_cast_to_float_(&local_c8);
      Mat::~Mat((Mat *)0x12d43b);
      for (local_cc = 0; local_cc < local_28; local_cc = local_cc + 1) {
        if (in_stack_ffffffffffffff10[local_cc] <= 0.0 && in_stack_ffffffffffffff10[local_cc] != 0.0
           ) {
          in_stack_ffffffffffffff10[local_cc] =
               *(float *)(in_RDI + 0x80) * in_stack_ffffffffffffff10[local_cc];
        }
      }
      local_90 = in_stack_ffffffffffffff10;
    }
  }
  else {
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      this_00 = &local_70;
      Mat::channel(this_00,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      pfVar1 = Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x12d350);
      for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
        if (pfVar1[local_80] <= 0.0 && pfVar1[local_80] != 0.0) {
          pfVar1[local_80] = 0.0;
        }
      }
      local_38 = pfVar1;
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}